

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

int If_CutDsdPermLitMax(char *pPermLits,int nVars,int iVar)

{
  int iVar1;
  int local_1c;
  int i;
  int iVar_local;
  int nVars_local;
  char *pPermLits_local;
  
  if ((-1 < iVar) && (iVar < nVars)) {
    local_1c = 0;
    while( true ) {
      if (nVars <= local_1c) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x8b0,"int If_CutDsdPermLitMax(char *, int, int)");
      }
      iVar1 = Abc_Lit2Var((int)pPermLits[local_1c]);
      if (iVar == iVar1) break;
      local_1c = local_1c + 1;
    }
    return local_1c;
  }
  __assert_fail("iVar >= 0 && iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x8ac,"int If_CutDsdPermLitMax(char *, int, int)");
}

Assistant:

int If_CutDsdPermLitMax( char * pPermLits, int nVars, int iVar )
{
    int i;
    assert( iVar >= 0 && iVar < nVars );
    for ( i = 0; i < nVars; i++ )
        if ( iVar == Abc_Lit2Var((int)pPermLits[i]) )
            return i;
    assert( 0 );
    return -1;
}